

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O3

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *filename;
  char cVar1;
  char cVar2;
  cmCommand *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  size_type *psVar9;
  string message;
  string sdestdir;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  mode_t *local_40;
  mode_t local_34;
  
  filename = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (iVar7 = std::__cxx11::string::compare((char *)filename), iVar7 != 0)) {
    pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "called with inappropriate arguments. No DESTINATION provided or .","");
    cmCommand::SetError(pcVar3,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar5 = cmsys::SystemTools::GetEnv("DESTDIR",&local_60);
  if (bVar5 && local_60._M_string_length != 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
    pcVar4 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
    cVar1 = *pcVar4;
    bVar5 = true;
    if (2 < (this->super_cmFileCopier).Destination._M_string_length) {
      bVar5 = pcVar4[2] != '/';
    }
    cVar2 = pcVar4[1];
    if (cVar1 != '/') {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if (cVar2 != ':' || bVar5) {
LAB_002ebe6e:
          pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,
                     "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                     ,"");
          cmCommand::SetError(pcVar3,&local_a0);
          goto LAB_002ec0eb;
        }
      }
      else if ((cVar2 != ':' || bVar5) || (byte)(cVar1 + 0xa5U) < 0xe6) goto LAB_002ebe6e;
LAB_002ebea5:
      std::__cxx11::string::substr((ulong)&local_80,(ulong)filename);
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,(ulong)local_60._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0.field_2._8_8_ = plVar8[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)filename,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this->DestDirLength = (int)local_60._M_string_length;
      goto LAB_002ebf61;
    }
    if (cVar2 != '/') goto LAB_002ebea5;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
               ,"");
    std::__cxx11::string::_M_append
              ((char *)&local_a0,(ulong)(this->super_cmFileCopier).Destination._M_dataplus._M_p);
    cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_a0);
LAB_002ec0eb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_002ebf61:
    local_40 = &local_34;
    local_34 = 0;
    bVar5 = cmFileCopier::GetDefaultDirectoryPermissions(&this->super_cmFileCopier,&local_40);
    if (bVar5) {
      bVar5 = true;
      if (*(int *)&(this->super_cmFileCopier).field_0xf4 == 6) goto LAB_002ec104;
      bVar6 = cmsys::SystemTools::FileExists(filename);
      if ((bVar6) || (bVar6 = cmsys::SystemTools::MakeDirectory(filename,local_40), bVar6)) {
        bVar6 = cmsys::SystemTools::FileIsDirectory(filename);
        if (bVar6) goto LAB_002ec104;
        std::operator+(&local_80,"INSTALL destination: ",filename);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_a0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_a0);
      }
      else {
        std::operator+(&local_80,"cannot create directory: ",filename);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_a0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&local_a0);
      }
      goto LAB_002ec0eb;
    }
  }
  bVar5 = false;
LAB_002ec104:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if (destination.size() < 2 && destination != "/") {
    this->FileCommand->SetError("called with inappropriate arguments. "
                                "No DESTINATION provided or .");
    return false;
  }

  std::string sdestdir;
  if (cmSystemTools::GetEnv("DESTDIR", sdestdir) && !sdestdir.empty()) {
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if (destination.size() > 2) {
      ch3 = destination[2];
    }
    int skip = 0;
    if (ch1 != '/') {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
          ch2 == ':') {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if (ch3 != '/') {
          relative = 1;
        }
      } else {
        relative = 1;
      }
      if (relative) {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
      }
    } else {
      if (ch2 == '/') {
        // looks like a network path.
        std::string message =
          "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
      }
    }
    destination = sdestdir + destination.substr(skip);
    this->DestDirLength = int(sdestdir.size());
  }

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  if (this->InstallType != cmInstallType_DIRECTORY) {
    if (!cmSystemTools::FileExists(destination)) {
      if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
      }
    }
    if (!cmSystemTools::FileIsDirectory(destination)) {
      std::string errstring =
        "INSTALL destination: " + destination + " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
    }
  }
  return true;
}